

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall absl::lts_20240722::flags_internal::FlagImpl::InvokeCallback(FlagImpl *this)

{
  FlagCallbackFunc p_Var1;
  MutexLock lock;
  MutexRelock relock;
  MutexLock local_20;
  MutexRelock local_18;
  
  if (this->callback_ != (FlagCallback *)0x0) {
    p_Var1 = this->callback_->func;
    local_18.mu_ = DataGuard(this);
    absl::lts_20240722::Mutex::Unlock();
    local_20.mu_ = &this->callback_->guard;
    absl::lts_20240722::Mutex::Lock();
    (*p_Var1)();
    MutexLock::~MutexLock(&local_20);
    anon_unknown_0::MutexRelock::~MutexRelock(&local_18);
  }
  return;
}

Assistant:

void FlagImpl::InvokeCallback() const {
  if (!callback_) return;

  // Make a copy of the C-style function pointer that we are about to invoke
  // before we release the lock guarding it.
  FlagCallbackFunc cb = callback_->func;

  // If the flag has a mutation callback this function invokes it. While the
  // callback is being invoked the primary flag's mutex is unlocked and it is
  // re-locked back after call to callback is completed. Callback invocation is
  // guarded by flag's secondary mutex instead which prevents concurrent
  // callback invocation. Note that it is possible for other thread to grab the
  // primary lock and update flag's value at any time during the callback
  // invocation. This is by design. Callback can get a value of the flag if
  // necessary, but it might be different from the value initiated the callback
  // and it also can be different by the time the callback invocation is
  // completed. Requires that *primary_lock be held in exclusive mode; it may be
  // released and reacquired by the implementation.
  MutexRelock relock(*DataGuard());
  absl::MutexLock lock(&callback_->guard);
  cb();
}